

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::can_compress_content_type(string *content_type)

{
  bool bVar1;
  long lVar2;
  bool local_11;
  string *content_type_local;
  
  lVar2 = std::__cxx11::string::find((char *)content_type,0x18a05d);
  if ((lVar2 == 0) && (bVar1 = std::operator!=(content_type,"text/event-stream"), bVar1)) {
    return true;
  }
  bVar1 = std::operator==(content_type,"image/svg+xml");
  local_11 = true;
  if (!bVar1) {
    bVar1 = std::operator==(content_type,"application/javascript");
    local_11 = true;
    if (!bVar1) {
      bVar1 = std::operator==(content_type,"application/json");
      local_11 = true;
      if (!bVar1) {
        bVar1 = std::operator==(content_type,"application/xml");
        local_11 = true;
        if (!bVar1) {
          local_11 = std::operator==(content_type,"application/xhtml+xml");
        }
      }
    }
  }
  return local_11;
}

Assistant:

inline bool can_compress_content_type(const std::string &content_type) {
			return (!content_type.find("text/") && content_type != "text/event-stream") ||
				   content_type == "image/svg+xml" ||
				   content_type == "application/javascript" ||
				   content_type == "application/json" ||
				   content_type == "application/xml" ||
				   content_type == "application/xhtml+xml";
		}